

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O1

void test_arithm<long>(uint length,long value1,long value2,bool allowTrash)

{
  ulong uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ulong uVar3;
  long lVar4;
  undefined8 *puVar5;
  undefined7 in_register_00000009;
  _func_int **pp_Var6;
  shared_ptr<long> pv1;
  shared_ptr<long> pv2;
  shared_ptr<long> presult;
  
  presult.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       (undefined4)CONCAT71(in_register_00000009,allowTrash);
  uVar1 = (ulong)length;
  uVar3 = 0xffffffffffffffff;
  if (-1 < (int)length) {
    uVar3 = (long)(int)length * 8;
  }
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__(uVar3);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<long*,void(*)(long*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv1,p_Var2,nosimd::common::free<long>);
  pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__(uVar3);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<long*,void(*)(long*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv2,
             pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             nosimd::common::free<long>);
  uVar3 = 0xffffffffffffffff;
  if (-1 < (int)(length + 1)) {
    uVar3 = (long)(int)(length + 1) * 8;
  }
  pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__(uVar3);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<long*,void(*)(long*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&presult,
             pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             nosimd::common::free<long>);
  (&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _vptr__Sp_counted_base)[uVar1] = (_func_int **)0x7f;
  if (0 < (int)length) {
    uVar3 = 0;
    do {
      (&p_Var2->_vptr__Sp_counted_base)[uVar3] = (_func_int **)value1;
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
    if (0 < (int)length) {
      uVar3 = 0;
      do {
        (&(pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base)[uVar3] = (_func_int **)value2;
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
  }
  if (length != 0) {
    lVar4 = 0;
    do {
      if (((&p_Var2->_vptr__Sp_counted_base)[lVar4] != (_func_int **)value1) ||
         ((&(pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[lVar4] != (_func_int **)value2)) {
        puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar5 = "void test_arithm(unsigned int, T, T, bool) [T = long]";
        *(undefined4 *)(puVar5 + 1) = 0x1a;
        *(uint *)((long)puVar5 + 0xc) = length;
        __cxa_throw(puVar5,&Exception::typeinfo,0);
      }
      lVar4 = lVar4 + 1;
    } while (length != (uint)lVar4);
  }
  if (p_Var2 == pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      uVar3 = 0;
      do {
        (&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base)[uVar3] =
             (_func_int **)
             ((long)(&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                      _vptr__Sp_counted_base)[uVar3] +
             (long)(&(pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                     _vptr__Sp_counted_base)[uVar3]);
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
  }
  else if (pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
           pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      uVar3 = 0;
      do {
        (&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base)[uVar3] =
             (_func_int **)
             ((long)(&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                      _vptr__Sp_counted_base)[uVar3] +
             (long)(&p_Var2->_vptr__Sp_counted_base)[uVar3]);
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
  }
  else if (0 < (int)length) {
    uVar3 = 0;
    do {
      (&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base)[uVar3] =
           (_func_int **)
           ((long)(&(pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                    _vptr__Sp_counted_base)[uVar3] + (long)(&p_Var2->_vptr__Sp_counted_base)[uVar3])
      ;
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  if (length != 0) {
    lVar4 = 0;
    do {
      if ((&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[lVar4] != (_func_int **)(value2 + value1)) {
        puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar5 = "void test_arithm(unsigned int, T, T, bool) [T = long]";
        *(undefined4 *)(puVar5 + 1) = 0x22;
        *(uint *)((long)puVar5 + 0xc) = length;
        __cxa_throw(puVar5,&Exception::typeinfo,0);
      }
      lVar4 = lVar4 + 1;
    } while (length != (uint)lVar4);
  }
  if (p_Var2 == pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      uVar3 = 0;
      do {
        (&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base)[uVar3] =
             (_func_int **)
             ((long)(&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                      _vptr__Sp_counted_base)[uVar3] -
             (long)(&(pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                     _vptr__Sp_counted_base)[uVar3]);
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
  }
  else if (0 < (int)length) {
    uVar3 = 0;
    do {
      (&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base)[uVar3] =
           (_func_int **)
           ((long)(&p_Var2->_vptr__Sp_counted_base)[uVar3] -
           (long)(&(pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                   _vptr__Sp_counted_base)[uVar3]);
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  if (length != 0) {
    lVar4 = 0;
    do {
      if ((&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[lVar4] != (_func_int **)(value1 - value2)) {
        puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar5 = "void test_arithm(unsigned int, T, T, bool) [T = long]";
        *(undefined4 *)(puVar5 + 1) = 0x2a;
        *(uint *)((long)puVar5 + 0xc) = length;
        __cxa_throw(puVar5,&Exception::typeinfo,0);
      }
      lVar4 = lVar4 + 1;
    } while (length != (uint)lVar4);
  }
  if (p_Var2 == pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      uVar3 = 0;
      do {
        (&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base)[uVar3] =
             (_func_int **)
             ((long)(&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                      _vptr__Sp_counted_base)[uVar3] *
             (long)(&(pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                     _vptr__Sp_counted_base)[uVar3]);
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
  }
  else if (pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
           pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      uVar3 = 0;
      do {
        (&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base)[uVar3] =
             (_func_int **)
             ((long)(&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                      _vptr__Sp_counted_base)[uVar3] *
             (long)(&p_Var2->_vptr__Sp_counted_base)[uVar3]);
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
  }
  else if (0 < (int)length) {
    uVar3 = 0;
    do {
      (&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base)[uVar3] =
           (_func_int **)
           ((long)(&(pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                    _vptr__Sp_counted_base)[uVar3] * (long)(&p_Var2->_vptr__Sp_counted_base)[uVar3])
      ;
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  if (length != 0) {
    lVar4 = 0;
    do {
      if ((&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[lVar4] != (_func_int **)(value2 * value1)) {
        puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar5 = "void test_arithm(unsigned int, T, T, bool) [T = long]";
        *(undefined4 *)(puVar5 + 1) = 0x32;
        *(uint *)((long)puVar5 + 0xc) = length;
        __cxa_throw(puVar5,&Exception::typeinfo,0);
      }
      lVar4 = lVar4 + 1;
    } while (length != (uint)lVar4);
  }
  pp_Var6 = (_func_int **)(value1 % value2);
  if (p_Var2 == pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      uVar3 = 0;
      do {
        pp_Var6 = (_func_int **)
                  ((long)(&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_vptr__Sp_counted_base)[uVar3] %
                  (long)(&(pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)->_vptr__Sp_counted_base)[uVar3]);
        (&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base)[uVar3] =
             (_func_int **)
             ((long)(&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                      _vptr__Sp_counted_base)[uVar3] /
             (long)(&(pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                     _vptr__Sp_counted_base)[uVar3]);
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
  }
  else if (0 < (int)length) {
    uVar3 = 0;
    do {
      pp_Var6 = (_func_int **)
                ((long)(&p_Var2->_vptr__Sp_counted_base)[uVar3] %
                (long)(&(pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                        ->_vptr__Sp_counted_base)[uVar3]);
      (&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base)[uVar3] =
           (_func_int **)
           ((long)(&p_Var2->_vptr__Sp_counted_base)[uVar3] /
           (long)(&(pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                   _vptr__Sp_counted_base)[uVar3]);
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  if (length != 0) {
    lVar4 = 0;
    do {
      if ((&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[lVar4] != (_func_int **)(value1 / value2)) {
        puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar5 = "void test_arithm(unsigned int, T, T, bool) [T = long]";
        *(undefined4 *)(puVar5 + 1) = 0x3a;
        *(uint *)((long)puVar5 + 0xc) = length;
        __cxa_throw(puVar5,&Exception::typeinfo,0);
      }
      lVar4 = lVar4 + 1;
    } while (length != (uint)lVar4);
  }
  if (p_Var2 == pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      uVar3 = 0;
      do {
        (&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base)[uVar3] =
             (_func_int **)
             ((long)(&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                      _vptr__Sp_counted_base)[uVar3] + value2);
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
  }
  else if (0 < (int)length) {
    uVar3 = 0;
    do {
      pp_Var6 = (_func_int **)((long)(&p_Var2->_vptr__Sp_counted_base)[uVar3] + value2);
      (&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base)[uVar3] = pp_Var6;
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  if (length != 0) {
    lVar4 = 0;
    do {
      if ((&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[lVar4] != (_func_int **)(value2 + value1)) {
        puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar5 = "void test_arithm(unsigned int, T, T, bool) [T = long]";
        *(undefined4 *)(puVar5 + 1) = 0x43;
        *(uint *)((long)puVar5 + 0xc) = length;
        __cxa_throw(puVar5,&Exception::typeinfo,0);
      }
      lVar4 = lVar4 + 1;
    } while (length != (uint)lVar4);
  }
  if (p_Var2 == pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      uVar3 = 0;
      do {
        (&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base)[uVar3] =
             (_func_int **)
             ((long)(&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                      _vptr__Sp_counted_base)[uVar3] - value2);
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
  }
  else if (0 < (int)length) {
    uVar3 = 0;
    do {
      pp_Var6 = (_func_int **)((long)(&p_Var2->_vptr__Sp_counted_base)[uVar3] - value2);
      (&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base)[uVar3] = pp_Var6;
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  if (length != 0) {
    lVar4 = 0;
    do {
      if ((&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[lVar4] != (_func_int **)(value1 - value2)) {
        puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar5 = "void test_arithm(unsigned int, T, T, bool) [T = long]";
        *(undefined4 *)(puVar5 + 1) = 0x4b;
        *(uint *)((long)puVar5 + 0xc) = length;
        __cxa_throw(puVar5,&Exception::typeinfo,0);
      }
      lVar4 = lVar4 + 1;
    } while (length != (uint)lVar4);
  }
  if (0 < (int)length) {
    uVar3 = 0;
    do {
      pp_Var6 = (_func_int **)(value2 - (long)(&p_Var2->_vptr__Sp_counted_base)[uVar3]);
      (&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base)[uVar3] = pp_Var6;
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  if (length != 0) {
    pp_Var6 = (_func_int **)0x0;
    do {
      if ((&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[(long)pp_Var6] != (_func_int **)(value2 - value1)) {
        puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar5 = "void test_arithm(unsigned int, T, T, bool) [T = long]";
        *(undefined4 *)(puVar5 + 1) = 0x53;
        *(uint *)((long)puVar5 + 0xc) = length;
        __cxa_throw(puVar5,&Exception::typeinfo,0);
      }
      pp_Var6 = (_func_int **)((long)pp_Var6 + 1);
    } while (length != (uint)pp_Var6);
  }
  if (p_Var2 == pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      uVar3 = 0;
      do {
        pp_Var6 = (_func_int **)
                  ((long)(&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_vptr__Sp_counted_base)[uVar3] * value2);
        (&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base)[uVar3] = pp_Var6;
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
  }
  else if (0 < (int)length) {
    uVar3 = 0;
    do {
      pp_Var6 = (_func_int **)((long)(&p_Var2->_vptr__Sp_counted_base)[uVar3] * value2);
      (&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base)[uVar3] = pp_Var6;
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  if (length != 0) {
    lVar4 = 0;
    do {
      if ((&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[lVar4] != (_func_int **)(value2 * value1)) {
        puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar5 = "void test_arithm(unsigned int, T, T, bool) [T = long]";
        *(undefined4 *)(puVar5 + 1) = 0x5b;
        *(uint *)((long)puVar5 + 0xc) = length;
        __cxa_throw(puVar5,&Exception::typeinfo,0);
      }
      lVar4 = lVar4 + 1;
    } while (length != (uint)lVar4);
  }
  if (p_Var2 == pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      uVar3 = 0;
      do {
        pp_Var6 = (_func_int **)
                  ((long)(&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_vptr__Sp_counted_base)[uVar3] % value2);
        (&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base)[uVar3] =
             (_func_int **)
             ((long)(&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                      _vptr__Sp_counted_base)[uVar3] / value2);
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
  }
  else if (0 < (int)length) {
    uVar3 = 0;
    do {
      pp_Var6 = (_func_int **)((long)(&p_Var2->_vptr__Sp_counted_base)[uVar3] % value2);
      (&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base)[uVar3] =
           (_func_int **)((long)(&p_Var2->_vptr__Sp_counted_base)[uVar3] / value2);
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  if (length != 0) {
    lVar4 = 0;
    do {
      if ((&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[lVar4] != (_func_int **)(value1 / value2)) {
        puVar5 = (undefined8 *)
                 __cxa_allocate_exception
                           (0x10,pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi,pp_Var6);
        *puVar5 = "void test_arithm(unsigned int, T, T, bool) [T = long]";
        *(undefined4 *)(puVar5 + 1) = 99;
        *(uint *)((long)puVar5 + 0xc) = length;
        __cxa_throw(puVar5,&Exception::typeinfo,0);
      }
      lVar4 = lVar4 + 1;
    } while (length != (uint)lVar4);
  }
  pp_Var6 = (_func_int **)(value2 / value1);
  if (0 < (int)length) {
    uVar3 = 0;
    do {
      value1 = (long)(&p_Var2->_vptr__Sp_counted_base)[uVar3];
      (&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base)[uVar3] = (_func_int **)(value2 / value1);
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  if (length != 0) {
    lVar4 = 0;
    do {
      if ((&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[lVar4] != pp_Var6) {
        puVar5 = (undefined8 *)
                 __cxa_allocate_exception
                           (0x10,pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi,value2 % value1);
        *puVar5 = "void test_arithm(unsigned int, T, T, bool) [T = long]";
        *(undefined4 *)(puVar5 + 1) = 0x6b;
        *(uint *)((long)puVar5 + 0xc) = length;
        __cxa_throw(puVar5,&Exception::typeinfo,0);
      }
      lVar4 = lVar4 + 1;
    } while (length != (uint)lVar4);
  }
  if ((presult.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_1_ == '\0')
     && ((&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _vptr__Sp_counted_base)[uVar1] != (_func_int **)0x7f)) {
    puVar5 = (undefined8 *)
             __cxa_allocate_exception
                       (0x10,pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi,value2 % value1);
    *puVar5 = "void test_arithm(unsigned int, T, T, bool) [T = long]";
    *(undefined4 *)(puVar5 + 1) = 0x70;
    *(uint *)((long)puVar5 + 0xc) = length;
    __cxa_throw(puVar5,&Exception::typeinfo,0);
  }
  if (presult.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               presult.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void test_arithm(unsigned length, T value1, T value2, bool allowTrash = false)
{
    auto pv1 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto pv2 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto presult = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * v1 = pv1.get();
    T * v2 = pv2.get();
    T * result = presult.get();
    result[length] = 0x7f;

    simd::set(value1, v1, length);
    simd::set(value2, v2, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(v1[i], value1) || ! equal(v2[i], value2))
            FAIL();
    }

    T r = value1 + value2;
    arithm::add(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    arithm::sub(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    arithm::mul(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 / value2;
    arithm::div(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

#ifndef TEST_FIXED
    r = value1 + value2;
    simd::addC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    simd::subC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value2 - value1;
    simd::subCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    simd::mulC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value1 / value2;
    simd::divC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value2 / value1;
    simd::divCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }
#endif // TEST_FIXED

    if (!allowTrash && result[length] != 0x7f)
        FAIL();
}